

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O0

void __thiscall
Js::HeapArgumentsObject::HeapArgumentsObject
          (HeapArgumentsObject *this,Recycler *recycler,ActivationObject *obj,uint32 formalCount,
          DynamicType *type)

{
  code *pcVar1;
  bool bVar2;
  ActivationObject **ppAVar3;
  undefined4 *puVar4;
  WriteBarrierPtr<Js::ActivationObject> local_40;
  nullptr_t local_38;
  DynamicType *local_30;
  DynamicType *type_local;
  ActivationObject *pAStack_20;
  uint32 formalCount_local;
  ActivationObject *obj_local;
  Recycler *recycler_local;
  HeapArgumentsObject *this_local;
  
  local_30 = type;
  type_local._4_4_ = formalCount;
  pAStack_20 = obj;
  obj_local = (ActivationObject *)recycler;
  recycler_local = (Recycler *)this;
  ArgumentsObject::ArgumentsObject(&this->super_ArgumentsObject,type);
  (this->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01df6228;
  *(uint *)&this->field_0x20 = *(uint *)&this->field_0x20 & 0x80000000;
  *(uint *)&this->field_0x20 = *(uint *)&this->field_0x20 & 0x7fffffff;
  this->formalCount = type_local._4_4_;
  Memory::WriteBarrierPtr<Js::ActivationObject>::WriteBarrierPtr(&this->frameObject,pAStack_20);
  local_38 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<BVSparse<Memory::Recycler>_>::WriteBarrierPtr
            (&this->deletedArgs,&local_38);
  ppAVar3 = Memory::WriteBarrierPtr::operator_cast_to_ActivationObject__
                      ((WriteBarrierPtr *)&this->frameObject);
  if (*ppAVar3 != (ActivationObject *)0x0) {
    Memory::WriteBarrierPtr<Js::ActivationObject>::WriteBarrierPtr(&local_40,&this->frameObject);
    bVar2 = VarIsCorrectType<Js::ActivationObject>(&local_40);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArgumentsObject.cpp"
                                  ,0x26,"(!frameObject || VarIsCorrectType(frameObject))",
                                  "!frameObject || VarIsCorrectType(frameObject)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  return;
}

Assistant:

HeapArgumentsObject::HeapArgumentsObject(Recycler *recycler, ActivationObject* obj, uint32 formalCount, DynamicType * type)
        : ArgumentsObject(type), frameObject(obj), formalCount(formalCount), numOfArguments(0), callerDeleted(false), deletedArgs(nullptr)
    {
        Assert(!frameObject || VarIsCorrectType(frameObject));
    }